

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupSliced(Gia_Man_t *p,int nSuppMax)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *pGStack_10;
  int nSuppMax_local;
  Gia_Man_t *p_local;
  
  pNew._4_4_ = nSuppMax;
  pGStack_10 = p;
  pObj = (Gia_Obj_t *)Gia_ManStart(5000);
  pcVar4 = Abc_UtilStrsav(pGStack_10->pName);
  *(char **)pObj = pcVar4;
  pGVar5 = Gia_ManConst0(pGStack_10);
  pGVar5->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar3 = local_2c;
    iVar1 = Vec_IntSize(pGStack_10->vCis);
    bVar6 = false;
    if (iVar3 < iVar1) {
      pGStack_28 = Gia_ManCi(pGStack_10,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi((Gia_Man_t *)pObj);
    pGStack_28->Value = uVar2;
    local_2c = local_2c + 1;
  }
  Gia_ManCleanMark01(pGStack_10);
  local_2c = 0;
  while( true ) {
    bVar6 = false;
    if (local_2c < pGStack_10->nObjs) {
      pGStack_28 = Gia_ManObj(pGStack_10,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pGStack_28);
    if (iVar3 != 0) {
      iVar3 = Gia_ManSuppSize(pGStack_10,&local_2c,1);
      pGVar5 = pObj;
      if (pNew._4_4_ < iVar3) {
        pGVar5 = Gia_ObjFanin0(pGStack_28);
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xbfffffffffffffff | 0x4000000000000000;
        pGVar5 = Gia_ObjFanin1(pGStack_28);
        *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xbfffffffffffffff | 0x4000000000000000;
      }
      else {
        iVar3 = Gia_ObjFanin0Copy(pGStack_28);
        iVar1 = Gia_ObjFanin1Copy(pGStack_28);
        uVar2 = Gia_ManAppendAnd((Gia_Man_t *)pGVar5,iVar3,iVar1);
        pGStack_28->Value = uVar2;
        *(ulong *)pGStack_28 = *(ulong *)pGStack_28 & 0xffffffffbfffffff | 0x40000000;
      }
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar3 = local_2c;
    iVar1 = Vec_IntSize(pGStack_10->vCos);
    bVar6 = false;
    if (iVar3 < iVar1) {
      pGStack_28 = Gia_ManCo(pGStack_10,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pGVar5 = Gia_ObjFanin0(pGStack_28);
    *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xbfffffffffffffff | 0x4000000000000000;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    bVar6 = false;
    if (local_2c < pGStack_10->nObjs) {
      pGStack_28 = Gia_ManObj(pGStack_10,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pGStack_28);
    if (((iVar3 != 0) && ((*(ulong *)pGStack_28 >> 0x1e & 1) != 0)) &&
       ((*(ulong *)pGStack_28 >> 0x3e & 1) != 0)) {
      Gia_ManAppendCo((Gia_Man_t *)pObj,pGStack_28->Value);
    }
    local_2c = local_2c + 1;
  }
  Gia_ManCleanMark01(pGStack_10);
  return (Gia_Man_t *)pObj;
}

Assistant:

Gia_Man_t * Gia_ManDupSliced( Gia_Man_t * p, int nSuppMax )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create constant and PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManCleanMark01(p);
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ManSuppSize(p, &i, 1) <= nSuppMax )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            pObj->fMark0 = 1;
        }
        else 
        {
            Gia_ObjFanin0(pObj)->fMark1 = 1;
            Gia_ObjFanin1(pObj)->fMark1 = 1;
        }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark1 = 1;
    // add POs for the nodes pointed to
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->fMark0 && pObj->fMark1 )
            Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup and leave
    Gia_ManCleanMark01(p);
    return pNew;
}